

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_multiple_outputs1(APITests *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_41;
  _Vector_base<int,_std::allocator<int>_> local_40;
  undefined8 local_28;
  vector<int,_std::allocator<int>_> channels;
  
  GPIO::setmode(BOARD);
  local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = (this->pin_data).out_a;
  local_40._M_impl.super__Vector_impl_data._M_start._4_4_ = (this->pin_data).out_b;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_40;
  std::vector<int,_std::allocator<int>_>::vector(&channels,__l,(allocator_type *)&local_28);
  GPIO::setup((vector *)&channels,OUT,-1);
  local_28 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,__l_00,&local_41);
  GPIO::output((vector *)&channels,(vector *)&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  local_28 = 0x100000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,__l_01,&local_41);
  GPIO::output((vector *)&channels,(vector *)&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  GPIO::cleanup();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&channels.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_multiple_outputs1()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, {GPIO::HIGH, GPIO::LOW});
        GPIO::output(channels, {GPIO::LOW, GPIO::HIGH});
        GPIO::cleanup();
    }